

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O2

string * __thiscall
pbrt::TabulatedBSSRDF::ToString_abi_cxx11_(string *__return_storage_ptr__,TabulatedBSSRDF *this)

{
  BSSRDFTable *unaff_RBX;
  
  StringPrintf<pbrt::Point3<float>const&,float_const&,pbrt::Normal3<float>const&,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&,pbrt::BSSRDFTable_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ TabulatedBSSRDF po: %s eta: %f ns: %s sigma_t: %s rho: %s table: %s ]",
             (char *)this,(Point3<float> *)&this->eta,(float *)&this->ns,
             (Normal3<float> *)&this->sigma_t,&this->rho,(SampledSpectrum *)this->table,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string TabulatedBSSRDF::ToString() const {
    return StringPrintf(
        "[ TabulatedBSSRDF po: %s eta: %f ns: %s sigma_t: %s rho: %s table: %s ]", po,
        eta, ns, sigma_t, rho, *table);
}